

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-typed-test.cc
# Opt level: O2

char * __thiscall
testing::internal::TypedTestCasePState::VerifyRegisteredTestNames
          (TypedTestCasePState *this,char *file,int line,char *registered_tests)

{
  internal *piVar1;
  _Rb_tree_node_base *p_Var2;
  FILE *__stream;
  bool bVar3;
  __type _Var4;
  size_type sVar5;
  _Rb_tree_node_base *p_Var6;
  int line_00;
  char *pcVar7;
  char *extraout_RDX;
  char *str;
  char *extraout_RDX_00;
  internal *this_00;
  string *name;
  pointer __x;
  Message errors;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  name_vec;
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  tests;
  scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_e0;
  TypedTestCasePState *local_d8;
  uint local_cc;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_c8;
  internal *local_b0;
  char *local_a8;
  string local_a0;
  undefined1 local_80 [32];
  _Base_ptr local_60;
  size_t local_58;
  string local_50;
  
  *this = (TypedTestCasePState)0x1;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_c8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this_00 = (internal *)(registered_tests + -1);
  pcVar7 = registered_tests;
  local_d8 = this;
  local_b0 = (internal *)file;
  do {
    piVar1 = this_00 + 1;
    this_00 = this_00 + 1;
    bVar3 = IsSpace((char)*piVar1);
  } while (bVar3);
  str = extraout_RDX;
  while (this_00 != (internal *)0x0) {
    GetPrefixUntilComma_abi_cxx11_(&local_a0,this_00,str);
    StripTrailingSpaces((string *)local_80,&local_a0);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_c8,
               (string *)local_80);
    std::__cxx11::string::~string((string *)local_80);
    std::__cxx11::string::~string((string *)&local_a0);
    this_00 = (internal *)SkipComma((char *)this_00);
    str = extraout_RDX_00;
  }
  local_cc = line;
  local_a8 = registered_tests;
  Message::Message((Message *)&local_e0);
  local_80._24_8_ = local_80 + 8;
  local_80._8_4_ = _S_red;
  local_80._16_8_ = 0;
  local_58 = 0;
  p_Var2 = (_Rb_tree_node_base *)(local_d8 + 0x10);
  __x = local_c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start;
  local_60 = (_Base_ptr)local_80._24_8_;
  do {
    if (__x == local_c8.
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_d8 + 0x20); line_00 = (int)pcVar7,
          p_Var6 != p_Var2; p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        sVar5 = std::
                set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_80,(key_type *)(p_Var6 + 1));
        if (sVar5 == 0) {
          std::operator<<((ostream *)(local_e0.ptr_ + 0x10),"You forgot to list test ");
          std::operator<<((ostream *)(local_e0.ptr_ + 0x10),(string *)(p_Var6 + 1));
          std::operator<<((ostream *)(local_e0.ptr_ + 0x10),".\n");
        }
      }
      StringStreamToString(&local_a0,local_e0.ptr_);
      bVar3 = std::operator!=(&local_a0,"");
      pcVar7 = local_a8;
      __stream = _stderr;
      if (!bVar3) {
        std::__cxx11::string::~string((string *)&local_a0);
        std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80);
        scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&local_e0);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_c8);
        return pcVar7;
      }
      FormatFileLocation_abi_cxx11_(&local_50,local_b0,(char *)(ulong)local_cc,line_00);
      fprintf(__stream,"%s %s",local_50._M_dataplus._M_p,local_a0._M_dataplus._M_p);
      std::__cxx11::string::~string((string *)&local_50);
      fflush(_stderr);
      abort();
    }
    sVar5 = std::
            set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::count((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)local_80,__x);
    if (sVar5 == 0) {
      for (p_Var6 = *(_Rb_tree_node_base **)(local_d8 + 0x20); p_Var6 != p_Var2;
          p_Var6 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var6)) {
        _Var4 = std::operator==(__x,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)(p_Var6 + 1));
        if (_Var4) {
          std::
          _Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
          ::_M_insert_unique<std::__cxx11::string_const&>
                    ((_Rb_tree<std::__cxx11::string,std::__cxx11::string,std::_Identity<std::__cxx11::string>,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                      *)local_80,__x);
          goto LAB_003f1652;
        }
      }
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10),"No test named ");
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10),(string *)__x);
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10)," can be found in this test case.\n");
    }
    else {
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10),"Test ");
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10),(string *)__x);
      std::operator<<((ostream *)(local_e0.ptr_ + 0x10)," is listed more than once.\n");
    }
LAB_003f1652:
    __x = __x + 1;
  } while( true );
}

Assistant:

const char* TypedTestCasePState::VerifyRegisteredTestNames(
    const char* file, int line, const char* registered_tests) {
  typedef RegisteredTestsMap::const_iterator RegisteredTestIter;
  registered_ = true;

  std::vector<std::string> name_vec = SplitIntoTestNames(registered_tests);

  Message errors;

  std::set<std::string> tests;
  for (std::vector<std::string>::const_iterator name_it = name_vec.begin();
       name_it != name_vec.end(); ++name_it) {
    const std::string& name = *name_it;
    if (tests.count(name) != 0) {
      errors << "Test " << name << " is listed more than once.\n";
      continue;
    }

    bool found = false;
    for (RegisteredTestIter it = registered_tests_.begin();
         it != registered_tests_.end();
         ++it) {
      if (name == it->first) {
        found = true;
        break;
      }
    }

    if (found) {
      tests.insert(name);
    } else {
      errors << "No test named " << name
             << " can be found in this test case.\n";
    }
  }

  for (RegisteredTestIter it = registered_tests_.begin();
       it != registered_tests_.end();
       ++it) {
    if (tests.count(it->first) == 0) {
      errors << "You forgot to list test " << it->first << ".\n";
    }
  }

  const std::string& errors_str = errors.GetString();
  if (errors_str != "") {
    fprintf(stderr, "%s %s", FormatFileLocation(file, line).c_str(),
            errors_str.c_str());
    fflush(stderr);
    posix::Abort();
  }

  return registered_tests;
}